

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O3

back_insert_iterator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
 tcb::unicode::
 utf_convert<char32_t,__gnu_cxx::__normal_iterator<char16_t_const*,std::__cxx11::u16string>,__gnu_cxx::__normal_iterator<char16_t_const*,std::__cxx11::u16string>,std::back_insert_iterator<std::__cxx11::u32string>,char16_t>
           (__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
            first,__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
                  last,
           back_insert_iterator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
           out)

{
  code_point __c;
  __normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  local_20;
  
  if (first._M_current != last._M_current) {
    local_20._M_current = first._M_current;
    do {
      __c = detail::utf_traits<char16_t,2>::
            decode<__gnu_cxx::__normal_iterator<char16_t_const*,std::__cxx11::u16string>,__gnu_cxx::__normal_iterator<char16_t_const*,std::__cxx11::u16string>>
                      (&local_20,last);
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      push_back(out.container,__c);
    } while (local_20._M_current != last._M_current);
  }
  return (back_insert_iterator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
          )out.container;
}

Assistant:

TCB_CONSTEXPR14
OutIter utf_convert(InIter first, Sentinel last, OutIter out)
{
    while (first != last) {
        const char32_t c = detail::utf_traits<InCharT>::decode(first, last);
        detail::utf_traits<OutCharT>::encode(c, out);
    }
    return out;
}